

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_Test::testBody
          (TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_Test *this)

{
  int iVar1;
  char *pcVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  
  pcVar2 = MemoryLeakDetector::allocMemory
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)
                       ->super_TestMemoryAllocator,4,false);
  MemoryLeakDetector::deallocMemory
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
             &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
              super_TestMemoryAllocator,pcVar2,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar3 = UtestShell::getCurrent();
  pcVar2 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"No memory leaks",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xe9);
  pUVar3 = UtestShell::getCurrent();
  iVar1 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
                   super_TestMemoryAllocator).field_0x24;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,(long)iVar1,"LONGS_EQUAL(1, testAllocator->alloc_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xea,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  iVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->free_called;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,(long)iVar1,"LONGS_EQUAL(1, testAllocator->free_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xeb,pTVar4);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneAllocButNoLeak)
{
    char* mem = detector->allocMemory(testAllocator, 4);
    detector->deallocMemory(testAllocator, mem);
    detector->stopChecking();
    STRCMP_CONTAINS("No memory leaks", detector->report(mem_leak_period_checking));
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(1, testAllocator->free_called);
}